

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_unicode.c
# Opt level: O3

int PHYSFS_utf8stricmp(char *str1,char *str2)

{
  uint uVar1;
  uint uVar2;
  PHYSFS_uint32 PVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  PHYSFS_uint32 *pPVar7;
  int iVar8;
  int iVar9;
  PHYSFS_uint32 folded2 [3];
  PHYSFS_uint32 folded1 [3];
  char *local_58;
  char *local_50;
  PHYSFS_uint32 local_48 [6];
  
  iVar4 = 0;
  iVar8 = 0;
  iVar5 = 0;
  iVar9 = 0;
  do {
    if (iVar4 == iVar8) {
      PVar3 = __PHYSFS_utf8codepoint(&local_50);
      pPVar7 = local_48 + 3;
      iVar4 = PHYSFS_caseFold(PVar3,pPVar7);
      iVar8 = 1;
    }
    else {
      lVar6 = (long)iVar8;
      iVar8 = iVar8 + 1;
      pPVar7 = local_48 + lVar6 + 3;
    }
    uVar2 = *pPVar7;
    if (iVar5 == iVar9) {
      PVar3 = __PHYSFS_utf8codepoint(&local_58);
      iVar5 = PHYSFS_caseFold(PVar3,local_48);
      iVar9 = 1;
      pPVar7 = local_48;
    }
    else {
      lVar6 = (long)iVar9;
      iVar9 = iVar9 + 1;
      pPVar7 = local_48 + lVar6;
    }
    uVar1 = *pPVar7;
    if (uVar2 < uVar1) {
      return -1;
    }
    if (uVar2 >= uVar1 && uVar2 != uVar1) {
      return 1;
    }
  } while (uVar2 != 0);
  return 0;
}

Assistant:

int PHYSFS_utf8stricmp(const char *str1, const char *str2)
{
    UTFSTRICMP(8);
}